

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int fillword(int f,int n)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int local_2c;
  int local_24;
  int local_20;
  int nce;
  int i;
  int col;
  char c;
  int n_local;
  int f_local;
  
  nce = 0;
  local_20 = 0;
  while( true ) {
    if (fillcol < nce) {
      if (curwp->w_doto == curwp->w_dotp->l_used) {
        local_24 = 0;
      }
      else {
        selfinsert(f,n);
        local_24 = curwp->w_dotp->l_used - curwp->w_doto;
      }
      curwp->w_doto = local_20;
      cVar2 = curwp->w_dotp->l_text[curwp->w_doto];
      if ((cVar2 != ' ') && (cVar2 != '\t')) {
        do {
          backchar(8,1);
          cVar2 = curwp->w_dotp->l_text[curwp->w_doto];
          bVar3 = false;
          if ((cVar2 != ' ') && (bVar3 = false, cVar2 != '\t')) {
            bVar3 = 0 < curwp->w_doto;
          }
        } while (bVar3);
      }
      if (curwp->w_doto == 0) {
        do {
          forwchar(8,1);
          cVar2 = curwp->w_dotp->l_text[curwp->w_doto];
          bVar3 = false;
          if ((cVar2 != ' ') && (bVar3 = false, cVar2 != '\t')) {
            bVar3 = curwp->w_doto < curwp->w_dotp->l_used;
          }
        } while (bVar3);
      }
      delwhite(8,1);
      lnewline();
      local_2c = curwp->w_dotp->l_used - local_24;
      if (local_2c < 1) {
        local_2c = 0;
      }
      curwp->w_doto = local_2c;
      curwp->w_rflag = curwp->w_rflag | 2;
      if ((local_24 == 0) && (curwp->w_doto != 0)) {
        n_local = fillword(f,n);
      }
      else {
        n_local = 1;
      }
      return n_local;
    }
    if (local_20 == curwp->w_doto) break;
    bVar1 = curwp->w_dotp->l_text[local_20];
    if (bVar1 == 9) {
      nce = ntabstop(nce,curwp->w_bufp->b_tabw);
    }
    else if ((cinfo[bVar1] & 8U) != 0) {
      nce = nce + 1;
    }
    local_20 = local_20 + 1;
    nce = nce + 1;
  }
  iVar4 = selfinsert(f,n);
  return iVar4;
}

Assistant:

int
fillword(int f, int n)
{
	char	c;
	int	col, i, nce;

	for (i = col = 0; col <= fillcol; ++i, ++col) {
		if (i == curwp->w_doto)
			return selfinsert(f, n);
		c = lgetc(curwp->w_dotp, i);
		if (c == '\t')
			col = ntabstop(col, curwp->w_bufp->b_tabw);
		else if (ISCTRL(c) != FALSE)
			++col;
	}
	if (curwp->w_doto != llength(curwp->w_dotp)) {
		(void)selfinsert(f, n);
		nce = llength(curwp->w_dotp) - curwp->w_doto;
	} else
		nce = 0;
	curwp->w_doto = i;

	if ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' && c != '\t')
		do {
			(void)backchar(FFRAND, 1);
		} while ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' &&
		    c != '\t' && curwp->w_doto > 0);

	if (curwp->w_doto == 0)
		do {
			(void)forwchar(FFRAND, 1);
		} while ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' &&
		    c != '\t' && curwp->w_doto < llength(curwp->w_dotp));

	(void)delwhite(FFRAND, 1);
	(void)lnewline();
	i = llength(curwp->w_dotp) - nce;
	curwp->w_doto = i > 0 ? i : 0;
	curwp->w_rflag |= WFMOVE;
	if (nce == 0 && curwp->w_doto != 0)
		return (fillword(f, n));
	return (TRUE);
}